

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O3

void * uo_cb_manage_thrds(void *arg)

{
  UO_CB_THRD_STATE UVar1;
  atomic_size_t aVar2;
  int iVar3;
  long lVar4;
  void *__arg;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  timespec abs_timeout;
  long local_60;
  timespec local_58;
  double local_48;
  double dStack_40;
  
  thrdpool.thrd_count_target = 4;
  if (is_quitting != '\0') {
    thrdpool.thrd_count_target = 4;
    return (void *)0x0;
  }
  local_60 = 100;
  dVar8 = 500.0;
  __arg = (void *)0x0;
  uVar5 = thrdpool.thrd_count;
LAB_0010555e:
  aVar2 = thrdpool.thrd_count;
  if ((uVar5 < 0x10) && (uVar5 < thrdpool.thrd_count_target)) {
    LOCK();
    thrdpool.thrd_count = thrdpool.thrd_count + 1;
    UNLOCK();
    do {
      UVar1 = thrdpool.cb_thrds[(long)__arg].state;
      if (UVar1 == UO_CB_THRD_EXITED) {
        pthread_join(thrdpool.cb_thrds[(long)__arg].thrd,(void **)0x0);
        thrdpool.cb_thrds[(long)__arg].state = UO_CB_THRD_UNINITIALIZED;
      }
      else if (UVar1 == UO_CB_THRD_UNINITIALIZED) goto LAB_001055b3;
      __arg = (void *)(ulong)((int)__arg + 1U & 0xf);
    } while( true );
  }
  goto LAB_001055d7;
LAB_001055b3:
  uVar5 = aVar2 + 1;
  thrdpool.cb_thrds[(long)__arg].state = UO_CB_THRD_RUNNING;
  pthread_create(&thrdpool.cb_thrds[(long)__arg].thrd,(pthread_attr_t *)0x0,uo_cb_execute,__arg);
  if (is_quitting != '\x01') goto LAB_0010555e;
LAB_001055d7:
  clock_gettime(0,&local_58);
  dVar7 = fmod(dVar8 * 1000000.0,1000000000.0);
  lVar4 = (long)((double)local_58.tv_nsec + dVar7);
  local_58.tv_nsec = lVar4 + -1000000000;
  if (lVar4 < 1000000000) {
    local_58.tv_nsec = lVar4;
  }
  local_58.tv_sec = (long)(dVar8 / 1000.0) + local_58.tv_sec + (ulong)(999999999 < lVar4);
  iVar3 = sem_timedwait((sem_t *)&thrdpool.update_sem,&local_58);
  aVar2 = thrdpool.sample.completions;
  if (iVar3 == 0) goto LAB_0010582c;
  if (thrdpool.executing_count == 0) {
    local_60 = local_60 + -1;
    if (local_60 == 0) {
      if (thrdpool.thrd_count_target < 3) {
        sem_wait((sem_t *)&thrdpool.update_sem);
      }
      else {
        thrdpool.thrd_count_target = thrdpool.thrd_count_target - 1;
        dVar8 = dVar8 * 1.5;
      }
      local_60 = 100;
    }
    LOCK();
    thrdpool.sample.completions = 0;
    UNLOCK();
  }
  else {
    LOCK();
    thrdpool.sample.completions = 0;
    UNLOCK();
    uVar6 = (long)(thrdpool.sample.weighted_throughput - 9.223372036854776e+18) &
            (long)thrdpool.sample.weighted_throughput >> 0x3f |
            (long)thrdpool.sample.weighted_throughput;
    auVar9._8_4_ = (int)(aVar2 >> 0x20);
    auVar9._0_8_ = aVar2;
    auVar9._12_4_ = 0x45300000;
    dStack_40 = auVar9._8_8_ - 1.9342813113834067e+25;
    local_48 = (dStack_40 + ((double)CONCAT44(0x43300000,(int)aVar2) - 4503599627370496.0)) / dVar8;
    auVar10._8_4_ = (int)(thrdpool.thrd_count_target >> 0x20);
    auVar10._0_8_ = thrdpool.thrd_count_target;
    auVar10._12_4_ = 0x45300000;
    dVar7 = pow(0.95,(auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)thrdpool.thrd_count_target) -
                     4503599627370496.0));
    thrdpool.sample.weighted_throughput = dVar7 * local_48;
    auVar12._8_4_ = (int)(uVar6 >> 0x20);
    auVar12._0_8_ = uVar6;
    auVar12._12_4_ = 0x45300000;
    dVar7 = (auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
    thrdpool.sample.thrd_target_increase =
         thrdpool.sample.thrd_target_increase == dVar7 < thrdpool.sample.weighted_throughput;
    if (thrdpool.sample.thrd_target_increase) {
      lVar4 = 1;
      dVar11 = 1.5;
      if (thrdpool.thrd_count_target < 0x10) {
LAB_001057ad:
        thrdpool.thrd_count_target = thrdpool.thrd_count_target + lVar4;
        dVar11 = *(double *)
                  (&DAT_001065f0 + (ulong)(dVar7 < thrdpool.sample.weighted_throughput) * 8);
      }
    }
    else {
      lVar4 = -1;
      dVar11 = 1.5;
      if (2 < thrdpool.thrd_count_target) goto LAB_001057ad;
    }
    dVar8 = dVar8 * dVar11;
  }
  dVar7 = 10.0;
  if (10.0 <= dVar8) {
    dVar7 = dVar8;
  }
  dVar8 = (double)(-(ulong)(5000.0 < dVar8) & 0x40b3880000000000 |
                  ~-(ulong)(5000.0 < dVar8) & (ulong)dVar7);
LAB_0010582c:
  if (is_quitting == '\x01') {
    return (void *)0x0;
  }
  goto LAB_0010555e;
}

Assistant:

static void *uo_cb_manage_thrds(
    void *arg)
{
    thrdpool.thrd_count_target = UO_CB_THRD_COUNT_INI;

    size_t thrd_i = 0;
    size_t count = thrdpool.thrd_count;

    double duration_msec = UO_CB_THRDPOOL_TIMEO_INI;
    size_t pause_counter = UO_CB_THRDPOOL_PAUSE_COUNTER;

    while (!is_quitting)
    {
        while (!is_quitting && count < thrdpool.thrd_count_target && count < UO_CB_THRD_COUNT_MAX)
        {
            count = atomic_fetch_add(&thrdpool.thrd_count, 1) + 1;

            enum UO_CB_THRD_STATE thrd_state;

            while (thrd_state = thrdpool.cb_thrds[thrd_i].state)
            {
                if (thrd_state == UO_CB_THRD_EXITED)
                {
                    pthread_join(thrdpool.cb_thrds[thrd_i].thrd, NULL);
                    thrdpool.cb_thrds[thrd_i].state = UO_CB_THRD_UNINITIALIZED;
                }

                ++thrd_i;
                thrd_i %= UO_CB_THRD_COUNT_MAX;
            }

            thrdpool.cb_thrds[thrd_i].state = UO_CB_THRD_RUNNING;
            
            pthread_create(&thrdpool.cb_thrds[thrd_i].thrd, 0, uo_cb_execute, (void *)(uintptr_t)thrd_i);
        }

        struct timespec abs_timeout;
        clock_gettime(CLOCK_REALTIME, &abs_timeout);
        timespec_add_ms(&abs_timeout, duration_msec);

        if (sem_timedwait(&thrdpool.update_sem, &abs_timeout) != 0)
        {
            if (atomic_load(&thrdpool.executing_count))
            {
                size_t completions = atomic_exchange(&thrdpool.sample.completions, 0);

                size_t prev_weighted_throughput = thrdpool.sample.weighted_throughput;
                thrdpool.sample.weighted_throughput = completions / duration_msec * pow(1.0 - UO_CB_THRDPOOL_COST_PER_THRD, thrdpool.thrd_count_target);

                bool was_correct = thrdpool.sample.weighted_throughput > prev_weighted_throughput;
                thrdpool.sample.thrd_target_increase = !(was_correct ^ thrdpool.sample.thrd_target_increase);
                
                if (thrdpool.sample.thrd_target_increase)
                {
                    if (thrdpool.thrd_count_target < UO_CB_THRD_COUNT_MAX)
                    {
                        ++thrdpool.thrd_count_target;
                        duration_msec *= was_correct ? UO_CB_THRDPOOL_TIMEO_DEC_FACTOR : UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                }
                else
                {
                    if (thrdpool.thrd_count_target > UO_CB_THRD_COUNT_MIN)
                    {
                        --thrdpool.thrd_count_target;
                        duration_msec *= was_correct ? UO_CB_THRDPOOL_TIMEO_DEC_FACTOR : UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                }
            }
            else
            {
                if (--pause_counter == 0)
                {
                    if (thrdpool.thrd_count_target > UO_CB_THRD_COUNT_MIN)
                    {
                        --thrdpool.thrd_count_target;
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        sem_wait(&thrdpool.update_sem);

                    pause_counter = UO_CB_THRDPOOL_PAUSE_COUNTER;
                }
                
                atomic_store(&thrdpool.sample.completions, 0);
            }

            duration_msec = duration_msec > UO_CB_THRDPOOL_TIMEO_MAX
                ? UO_CB_THRDPOOL_TIMEO_MAX
                : duration_msec < UO_CB_THRDPOOL_TIMEO_MIN
                    ? UO_CB_THRDPOOL_TIMEO_MIN
                    : duration_msec;
        }
    }

    return NULL;
}